

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int mcalcmove(monst *mon)

{
  int iVar1;
  int iVar2;
  int local_14;
  int mmove;
  monst *mon_local;
  
  local_14 = (int)mon->data->mmove;
  if ((*(uint *)&mon->field_0x60 >> 10 & 3) == 1) {
    local_14 = (local_14 * 2 + 1) / 3;
  }
  else if ((*(uint *)&mon->field_0x60 >> 10 & 3) == 2) {
    local_14 = (local_14 * 4 + 2) / 3;
  }
  if (((mon == u.usteed) && (u.ugallop != 0)) && (flags.mv != '\0')) {
    iVar1 = rn2(2);
    iVar2 = 5;
    if (iVar1 != 0) {
      iVar2 = 4;
    }
    local_14 = (iVar2 * local_14) / 3;
  }
  return local_14;
}

Assistant:

int mcalcmove(struct monst *mon)
{
    int mmove = mon->data->mmove;

    /* Note: MSLOW's `+ 1' prevents slowed speed 1 getting reduced to 0;
     *	     MFAST's `+ 2' prevents hasted speed 1 from becoming a no-op;
     *	     both adjustments have negligible effect on higher speeds.
     */
    if (mon->mspeed == MSLOW)
	mmove = (2 * mmove + 1) / 3;
    else if (mon->mspeed == MFAST)
	mmove = (4 * mmove + 2) / 3;

    if (mon == u.usteed) {
	if (u.ugallop && flags.mv) {
	    /* average movement is 1.50 times normal */
	    mmove = ((rn2(2) ? 4 : 5) * mmove) / 3;
	}
    }

    return mmove;
}